

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaDeviceIndex Pa_GetDefaultOutputDevice(void)

{
  PaDeviceIndex PVar1;
  
  PVar1 = -1;
  if (((initializationCount_ != 0) && (-1 < (long)defaultHostApiIndex_)) &&
     (defaultHostApiIndex_ < hostApisCount_)) {
    PVar1 = (hostApis_[defaultHostApiIndex_]->info).defaultOutputDevice;
  }
  return PVar1;
}

Assistant:

PaDeviceIndex Pa_GetDefaultOutputDevice( void )
{
    PaHostApiIndex hostApi;
    PaDeviceIndex result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultOutputDevice" );

    hostApi = Pa_GetDefaultHostApi();
    if( hostApi < 0 )
    {
        result = paNoDevice;
    }
    else
    {
        result = hostApis_[hostApi]->info.defaultOutputDevice;
    }

    PA_LOGAPI_EXIT_T( "Pa_GetDefaultOutputDevice", "PaDeviceIndex: %d", result );

    return result;
}